

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O0

bool __thiscall
cmGeneratorExpressionDAGChecker::EvaluatingGenexExpression(cmGeneratorExpressionDAGChecker *this)

{
  long lVar1;
  bool local_11;
  cmGeneratorExpressionDAGChecker *this_local;
  
  lVar1 = std::__cxx11::string::find((char *)&this->Property,0x7c3ddc);
  local_11 = true;
  if (lVar1 != 0) {
    lVar1 = std::__cxx11::string::find((char *)&this->Property,0x7c3de3);
    local_11 = lVar1 == 0;
  }
  return local_11;
}

Assistant:

bool cmGeneratorExpressionDAGChecker::EvaluatingGenexExpression()
{
  return this->Property.find("TARGET_GENEX_EVAL:") == 0 ||
    this->Property.find("GENEX_EVAL:", 0) == 0;
}